

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NetworkUpdateParameters::clear_seed(NetworkUpdateParameters *this)

{
  Int64Parameter *this_00;
  Arena *pAVar1;
  NetworkUpdateParameters *this_local;
  
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (((pAVar1 == (Arena *)0x0) && (this->seed_ != (Int64Parameter *)0x0)) &&
     (this_00 = this->seed_, this_00 != (Int64Parameter *)0x0)) {
    Int64Parameter::~Int64Parameter(this_00);
    operator_delete(this_00,0x28);
  }
  this->seed_ = (Int64Parameter *)0x0;
  return;
}

Assistant:

void NetworkUpdateParameters::clear_seed() {
  if (GetArenaForAllocation() == nullptr && seed_ != nullptr) {
    delete seed_;
  }
  seed_ = nullptr;
}